

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gls::TextureTestUtil::ProgramLibrary::getProgram(ProgramLibrary *this,Program program)

{
  map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
  *this_00;
  GLSLVersion version_00;
  RenderContext *renderCtx;
  Program PVar1;
  bool bVar2;
  Program PVar3;
  iterator iVar4;
  mapped_type *ppSVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  ShaderProgram *this_01;
  TestError *this_02;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  Program program_local;
  string vertSrc;
  allocator<char> local_1de;
  allocator<char> local_1dd;
  uint local_1dc;
  string fragSrc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string version;
  key_type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_programs;
  program_local = program;
  iVar4 = std::
          _Rb_tree<deqp::gls::TextureTestUtil::Program,_std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>,_std::_Select1st<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
          ::find(&this_00->_M_t,&program_local);
  PVar1 = program_local;
  if ((_Rb_tree_header *)iVar4._M_node != &(this->m_programs)._M_t._M_impl.super__Rb_tree_header) {
    ppSVar5 = std::
              map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
              ::operator[](this_00,&program_local);
    return *ppSVar5;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PVar3 = program_local & ~PROGRAM_2D_SHADOW;
  bVar10 = PVar3 == PROGRAM_2D_ARRAY_FLOAT;
  if ((bVar10) || (6 < program_local - PROGRAM_1D_FLOAT && PVar3 != PROGRAM_1D_ARRAY_FLOAT)) {
    bVar9 = program_local - PROGRAM_BUFFER_FLOAT < 3;
    bVar8 = program_local < PROGRAM_2D_SHADOW_BIAS || PVar3 == PROGRAM_2D_ARRAY_FLOAT;
  }
  else {
    bVar9 = true;
    bVar8 = false;
    bVar10 = PVar3 == PROGRAM_1D_ARRAY_FLOAT;
  }
  local_1dc = program_local - PROGRAM_CUBE_ARRAY_FLOAT;
  version_00 = this->m_glslVersion;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((version_00 - GLSL_VERSION_300_ES < 3) || (version_00 == GLSL_VERSION_330)) {
    pcVar7 = glu::getGLSLVersionDeclaration(version_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,pcVar7,(allocator<char> *)&vertSrc);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    bVar11 = this->m_glslVersion == GLSL_VERSION_320_ES;
    if ((local_1dc < 4) || (bVar11 || !bVar2)) {
      if (!bVar11 && bVar2) {
        pcVar7 = "GL_EXT_texture_cube_map_array";
        goto LAB_00845ead;
      }
LAB_00845e8a:
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      local_188._M_string_length = 0;
      local_188.field_2._M_local_buf[0] = '\0';
      bVar2 = true;
    }
    else {
      if (PVar1 - PROGRAM_LAST < 0xfffffffd) goto LAB_00845e8a;
      pcVar7 = "GL_EXT_texture_buffer";
LAB_00845ead:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"\n#extension ",&local_1dd);
      std::operator+(&local_50,&local_70,pcVar7);
      std::operator+(&local_188,&local_50," : require");
      bVar2 = false;
    }
    std::operator+(&fragSrc,&version,&local_188);
    std::operator+(&vertSrc,&fragSrc,"\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FRAG_HEADER",&local_1de)
    ;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&local_90);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&vertSrc);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::__cxx11::string::~string((string *)&fragSrc);
    std::__cxx11::string::~string((string *)&local_188);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::operator+(&vertSrc,&version,"\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fragSrc,"VTX_HEADER",(allocator<char> *)&local_188);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&fragSrc);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&vertSrc);
    std::__cxx11::string::~string((string *)&fragSrc);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertSrc,"VTX_IN",(allocator<char> *)&fragSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&vertSrc);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertSrc,"VTX_OUT",(allocator<char> *)&fragSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&vertSrc);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertSrc,"FRAG_IN",(allocator<char> *)&fragSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&vertSrc);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertSrc,"FRAG_COLOR",(allocator<char> *)&fragSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&vertSrc);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&vertSrc);
LAB_0084611c:
    std::__cxx11::string::~string((string *)&version);
  }
  else if (version_00 == GLSL_VERSION_100_ES) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"FRAG_HEADER",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"VTX_HEADER",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"VTX_IN",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"VTX_OUT",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"FRAG_IN",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"FRAG_COLOR",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
    goto LAB_0084611c;
  }
  glu::getPrecisionName(this->m_texCoordPrecision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&version,"PRECISION",(allocator<char> *)&vertSrc);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,&version);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&version);
  if (local_1dc < 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"TEXCOORD_TYPE",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else if ((((PVar1 & ~PROGRAM_2D_SHADOW_BIAS) == PROGRAM_CUBE_FLOAT) ||
           (PVar1 - PROGRAM_3D_FLOAT < 6)) || ((bool)(bVar10 & bVar8))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"TEXCOORD_TYPE",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else if ((bool)(bVar10 & bVar9 | bVar8)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"TEXCOORD_TYPE",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else {
    if (!bVar9) goto LAB_00846272;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"TEXCOORD_TYPE",(allocator<char> *)&vertSrc);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&version);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&version);
LAB_00846272:
  if ((2 < this->m_glslVersion - GLSL_VERSION_300_ES) &&
     (this->m_glslVersion == GLSL_VERSION_100_ES)) {
    switch(program_local << 0x1e | program_local >> 2) {
    case PROGRAM_2D_FLOAT:
      break;
    case PROGRAM_2D_INT:
      break;
    case PROGRAM_2D_FLOAT_BIAS:
      break;
    case PROGRAM_2D_INT_BIAS:
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&version,"SAMPLER_TYPE",(allocator<char> *)&vertSrc);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,&version);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&version,"LOOKUP",(allocator<char> *)&vertSrc);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,&version);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragSrc,
             "${VTX_HEADER}${VTX_IN} highp vec4 a_position;\n${VTX_IN} ${PRECISION} ${TEXCOORD_TYPE} a_texCoord;\n${VTX_OUT} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,(allocator<char> *)&local_188);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&version,&fragSrc);
  tcu::StringTemplate::specialize(&vertSrc,(StringTemplate *)&version,&params);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&version);
  std::__cxx11::string::~string((string *)&fragSrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "${FRAG_HEADER}${FRAG_IN} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\nuniform ${PRECISION} float u_bias;\nuniform ${PRECISION} float u_ref;\nuniform ${PRECISION} vec4 u_colorScale;\nuniform ${PRECISION} vec4 u_colorBias;\nuniform ${PRECISION} ${SAMPLER_TYPE} u_sampler;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = ${LOOKUP} * u_colorScale + u_colorBias;\n}\n"
             ,(allocator<char> *)&local_90);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&version,&local_188);
  tcu::StringTemplate::specialize(&fragSrc,(StringTemplate *)&version,&params);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&version);
  std::__cxx11::string::~string((string *)&local_188);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  glu::makeVtxFragSources((ProgramSources *)&version,&vertSrc,&fragSrc);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)&version);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&version);
  if ((this_01->m_program).m_info.linkOk != false) {
    ppSVar5 = std::
              map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
              ::operator[](this_00,&program_local);
    *ppSVar5 = this_01;
    std::__cxx11::string::~string((string *)&fragSrc);
    std::__cxx11::string::~string((string *)&vertSrc);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    return this_01;
  }
  glu::operator<<(this->m_log,this_01);
  glu::ShaderProgram::~ShaderProgram(this_01);
  operator_delete(this_01,0xd0);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to compile shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
             ,0x108);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

glu::ShaderProgram* ProgramLibrary::getProgram (Program program)
{
	if (m_programs.find(program) != m_programs.end())
		return m_programs[program]; // Return from cache.

	static const char* vertShaderTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec4 a_position;\n"
		"${VTX_IN} ${PRECISION} ${TEXCOORD_TYPE} a_texCoord;\n"
		"${VTX_OUT} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_texCoord = a_texCoord;\n"
		"}\n";
	static const char* fragShaderTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\n"
		"uniform ${PRECISION} float u_bias;\n"
		"uniform ${PRECISION} float u_ref;\n"
		"uniform ${PRECISION} vec4 u_colorScale;\n"
		"uniform ${PRECISION} vec4 u_colorBias;\n"
		"uniform ${PRECISION} ${SAMPLER_TYPE} u_sampler;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = ${LOOKUP} * u_colorScale + u_colorBias;\n"
		"}\n";

	map<string, string> params;

	bool	isCube		= de::inRange<int>(program, PROGRAM_CUBE_FLOAT, PROGRAM_CUBE_SHADOW_BIAS);
	bool	isArray		= de::inRange<int>(program, PROGRAM_2D_ARRAY_FLOAT, PROGRAM_2D_ARRAY_SHADOW)
							|| de::inRange<int>(program, PROGRAM_1D_ARRAY_FLOAT, PROGRAM_1D_ARRAY_SHADOW);

	bool	is1D		= de::inRange<int>(program, PROGRAM_1D_FLOAT, PROGRAM_1D_UINT_BIAS)
							|| de::inRange<int>(program, PROGRAM_1D_ARRAY_FLOAT, PROGRAM_1D_ARRAY_SHADOW)
							|| de::inRange<int>(program, PROGRAM_BUFFER_FLOAT, PROGRAM_BUFFER_UINT);

	bool	is2D		= de::inRange<int>(program, PROGRAM_2D_FLOAT, PROGRAM_2D_UINT_BIAS)
							|| de::inRange<int>(program, PROGRAM_2D_ARRAY_FLOAT, PROGRAM_2D_ARRAY_SHADOW);

	bool	is3D		= de::inRange<int>(program, PROGRAM_3D_FLOAT, PROGRAM_3D_UINT_BIAS);
	bool	isCubeArray	= de::inRange<int>(program, PROGRAM_CUBE_ARRAY_FLOAT, PROGRAM_CUBE_ARRAY_SHADOW);
	bool	isBuffer	= de::inRange<int>(program, PROGRAM_BUFFER_FLOAT, PROGRAM_BUFFER_UINT);

	if (m_glslVersion == glu::GLSL_VERSION_100_ES)
	{
		params["FRAG_HEADER"]	= "";
		params["VTX_HEADER"]	= "";
		params["VTX_IN"]		= "attribute";
		params["VTX_OUT"]		= "varying";
		params["FRAG_IN"]		= "varying";
		params["FRAG_COLOR"]	= "gl_FragColor";
	}
	else if (m_glslVersion == glu::GLSL_VERSION_300_ES || m_glslVersion == glu::GLSL_VERSION_310_ES || m_glslVersion == glu::GLSL_VERSION_320_ES || m_glslVersion == glu::GLSL_VERSION_330)
	{
		const string	version	= glu::getGLSLVersionDeclaration(m_glslVersion);
		const char*		ext		= DE_NULL;

		if (glu::glslVersionIsES(m_glslVersion) && m_glslVersion != glu::GLSL_VERSION_320_ES) {
			if (isCubeArray)
				ext = "GL_EXT_texture_cube_map_array";
			else if (isBuffer)
				ext = "GL_EXT_texture_buffer";
		}

		params["FRAG_HEADER"]	= version + (ext ? string("\n#extension ") + ext + " : require" : string()) + "\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		params["VTX_HEADER"]	= version + "\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
	}
	else
		DE_FATAL("Unsupported version");

	params["PRECISION"]		= glu::getPrecisionName(m_texCoordPrecision);

	if (isCubeArray)
		params["TEXCOORD_TYPE"]	= "vec4";
	else if (isCube || (is2D && isArray) || is3D)
		params["TEXCOORD_TYPE"]	= "vec3";
	else if ((is1D && isArray) || is2D)
		params["TEXCOORD_TYPE"]	= "vec2";
	else if (is1D)
		params["TEXCOORD_TYPE"]	= "float";
	else
		DE_ASSERT(DE_FALSE);

	const char*	sampler	= DE_NULL;
	const char*	lookup	= DE_NULL;

	if (m_glslVersion == glu::GLSL_VERSION_300_ES || m_glslVersion == glu::GLSL_VERSION_310_ES || m_glslVersion == glu::GLSL_VERSION_320_ES || m_glslVersion == glu::GLSL_VERSION_330)
	{
		switch (program)
		{
			case PROGRAM_2D_FLOAT:			sampler = "sampler2D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_2D_INT:			sampler = "isampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_UINT:			sampler = "usampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_SHADOW:			sampler = "sampler2DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_2D_FLOAT_BIAS:		sampler = "sampler2D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_2D_INT_BIAS:		sampler = "isampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_2D_UINT_BIAS:		sampler = "usampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_2D_SHADOW_BIAS:	sampler = "sampler2DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_1D_FLOAT:			sampler = "sampler1D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_1D_INT:			sampler = "isampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_UINT:			sampler = "usampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_SHADOW:			sampler = "sampler1DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_1D_FLOAT_BIAS:		sampler = "sampler1D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_1D_INT_BIAS:		sampler = "isampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_1D_UINT_BIAS:		sampler = "usampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_1D_SHADOW_BIAS:	sampler = "sampler1DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_CUBE_FLOAT:		sampler = "samplerCube";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_CUBE_INT:			sampler = "isamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_UINT:			sampler = "usamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_SHADOW:		sampler = "samplerCubeShadow";		lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_CUBE_FLOAT_BIAS:	sampler = "samplerCube";			lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_CUBE_INT_BIAS:		sampler = "isamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_UINT_BIAS:	sampler = "usamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_SHADOW_BIAS:	sampler = "samplerCubeShadow";		lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_2D_ARRAY_FLOAT:	sampler = "sampler2DArray";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_2D_ARRAY_INT:		sampler = "isampler2DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_ARRAY_UINT:		sampler = "usampler2DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_ARRAY_SHADOW:	sampler = "sampler2DArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_3D_FLOAT:			sampler = "sampler3D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_3D_INT:			sampler = "isampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_3D_UINT:			sampler = "usampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_3D_FLOAT_BIAS:		sampler = "sampler3D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_3D_INT_BIAS:		sampler = "isampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_3D_UINT_BIAS:		sampler = "usampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_ARRAY_FLOAT:	sampler = "samplerCubeArray";		lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_CUBE_ARRAY_INT:	sampler = "isamplerCubeArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_ARRAY_UINT:	sampler = "usamplerCubeArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_ARRAY_SHADOW:	sampler = "samplerCubeArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_1D_ARRAY_FLOAT:	sampler = "sampler1DArray";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_1D_ARRAY_INT:		sampler = "isampler1DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_ARRAY_UINT:		sampler = "usampler1DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_ARRAY_SHADOW:	sampler = "sampler1DArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_BUFFER_FLOAT:		sampler = "samplerBuffer";			lookup = "texelFetch(u_sampler, int(v_texCoord))";										break;
			case PROGRAM_BUFFER_INT:		sampler = "isamplerBuffer";			lookup = "vec4(texelFetch(u_sampler, int(v_texCoord)))";								break;
			case PROGRAM_BUFFER_UINT:		sampler = "usamplerBuffer";			lookup = "vec4(texelFetch(u_sampler, int(v_texCoord)))";								break;
			default:
				DE_ASSERT(false);
		}
	}
	else if (m_glslVersion == glu::GLSL_VERSION_100_ES)
	{
		sampler = isCube ? "samplerCube" : "sampler2D";

		switch (program)
		{
			case PROGRAM_2D_FLOAT:			lookup = "texture2D(u_sampler, v_texCoord)";			break;
			case PROGRAM_2D_FLOAT_BIAS:		lookup = "texture2D(u_sampler, v_texCoord, u_bias)";	break;
			case PROGRAM_CUBE_FLOAT:		lookup = "textureCube(u_sampler, v_texCoord)";			break;
			case PROGRAM_CUBE_FLOAT_BIAS:	lookup = "textureCube(u_sampler, v_texCoord, u_bias)";	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_FATAL("Unsupported version");

	params["SAMPLER_TYPE"]	= sampler;
	params["LOOKUP"]		= lookup;

	std::string vertSrc = tcu::StringTemplate(vertShaderTemplate).specialize(params);
	std::string fragSrc = tcu::StringTemplate(fragShaderTemplate).specialize(params);

	glu::ShaderProgram* progObj = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(vertSrc, fragSrc));
	if (!progObj->isOk())
	{
		m_log << *progObj;
		delete progObj;
		TCU_FAIL("Failed to compile shader program");
	}

	try
	{
		m_programs[program] = progObj;
	}
	catch (...)
	{
		delete progObj;
		throw;
	}

	return progObj;
}